

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMakeLabel(Vdbe *v)

{
  uint uVar1;
  Parse *pPVar2;
  int *piVar3;
  
  pPVar2 = v->pParse;
  uVar1 = pPVar2->nLabel;
  pPVar2->nLabel = uVar1 + 1;
  if ((uVar1 & uVar1 - 1) == 0) {
    piVar3 = (int *)sqlite3DbReallocOrFree(pPVar2->db,pPVar2->aLabel,(long)(int)uVar1 * 8 + 4);
    pPVar2->aLabel = piVar3;
  }
  else {
    piVar3 = pPVar2->aLabel;
  }
  if (piVar3 != (int *)0x0) {
    piVar3[(int)uVar1] = -1;
  }
  return ~uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMakeLabel(Vdbe *v){
  Parse *p = v->pParse;
  int i = p->nLabel++;
  assert( v->magic==VDBE_MAGIC_INIT );
  if( (i & (i-1))==0 ){
    p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel, 
                                       (i*2+1)*sizeof(p->aLabel[0]));
  }
  if( p->aLabel ){
    p->aLabel[i] = -1;
  }
  return ADDR(i);
}